

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::Storage::installCustomFormatSpecifier
          (Storage *this,CustomFormatSpecifier *customFormatSpecifier)

{
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<el::CustomFormatSpecifier*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                    ((this->m_customFormatSpecifiers).
                     super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_customFormatSpecifiers).
                     super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->m_customFormatSpecifiers).
      super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
    push_back(&this->m_customFormatSpecifiers,customFormatSpecifier);
  }
  return;
}

Assistant:

void Storage::installCustomFormatSpecifier(const CustomFormatSpecifier& customFormatSpecifier) {
  if (hasCustomFormatSpecifier(customFormatSpecifier.formatSpecifier())) {
    return;
  }
  base::threading::ScopedLock scopedLock(customFormatSpecifiersLock());
  m_customFormatSpecifiers.push_back(customFormatSpecifier);
}